

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void btSoftBody::clusterDImpulse(Cluster *cluster,btVector3 *rpos,btVector3 *impulse)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = cluster->m_imass;
  fVar2 = impulse->m_floats[2];
  fVar10 = (float)*(undefined8 *)impulse->m_floats;
  fVar11 = (float)((ulong)*(undefined8 *)impulse->m_floats >> 0x20);
  fVar9 = rpos->m_floats[1] * fVar2 - fVar11 * rpos->m_floats[2];
  fVar8 = rpos->m_floats[2] * fVar10 - fVar2 * rpos->m_floats[0];
  fVar7 = fVar11 * rpos->m_floats[0] - fVar10 * rpos->m_floats[1];
  fVar3 = (cluster->m_invwi).m_el[2].m_floats[1];
  fVar4 = (cluster->m_invwi).m_el[2].m_floats[0];
  fVar5 = (cluster->m_invwi).m_el[2].m_floats[2];
  uVar6 = *(undefined8 *)cluster->m_dimpulses[0].m_floats;
  *(ulong *)cluster->m_dimpulses[0].m_floats =
       CONCAT44((float)((ulong)uVar6 >> 0x20) + fVar1 * fVar11,(float)uVar6 + fVar1 * fVar10);
  cluster->m_dimpulses[0].m_floats[2] = fVar1 * fVar2 + cluster->m_dimpulses[0].m_floats[2];
  uVar6 = *(undefined8 *)cluster->m_dimpulses[1].m_floats;
  *(ulong *)cluster->m_dimpulses[1].m_floats =
       CONCAT44((float)((ulong)uVar6 >> 0x20) +
                fVar7 * (cluster->m_invwi).m_el[1].m_floats[2] +
                fVar9 * (cluster->m_invwi).m_el[1].m_floats[0] +
                fVar8 * (cluster->m_invwi).m_el[1].m_floats[1],
                (float)uVar6 +
                fVar7 * (cluster->m_invwi).m_el[0].m_floats[2] +
                fVar9 * (cluster->m_invwi).m_el[0].m_floats[0] +
                fVar8 * (cluster->m_invwi).m_el[0].m_floats[1]);
  cluster->m_dimpulses[1].m_floats[2] =
       fVar5 * fVar7 + fVar4 * fVar9 + fVar3 * fVar8 + cluster->m_dimpulses[1].m_floats[2];
  cluster->m_ndimpulses = cluster->m_ndimpulses + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v, const btScalar& s)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	__m128	vs = _mm_load_ss(&s);	//	(S 0 0 0)
	vs = bt_pshufd_ps(vs, 0x80);	//	(S S S 0.0)
	return btVector3(_mm_mul_ps(v.mVec128, vs));
#elif defined(BT_USE_NEON)
	float32x4_t r = vmulq_n_f32(v.mVec128, s);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(v.m_floats[0] * s, v.m_floats[1] * s, v.m_floats[2] * s);
#endif
}